

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

LClosure * getcached(Proto *p,UpVal **encup,StkId base)

{
  UpVal **ppUVar1;
  LClosure *pLVar2;
  lu_byte *plVar3;
  ulong uVar4;
  TValue *pTVar5;
  
  pLVar2 = p->cache;
  if (pLVar2 != (LClosure *)0x0) {
    plVar3 = &p->upvalues->idx;
    uVar4 = 0;
    do {
      if ((uint)(~(p->sizeupvalues >> 0x1f) & p->sizeupvalues) == uVar4) {
        return pLVar2;
      }
      if (plVar3[-1] == 0) {
        pTVar5 = encup[*plVar3]->v;
      }
      else {
        pTVar5 = base + *plVar3;
      }
      ppUVar1 = pLVar2->upvals + uVar4;
      uVar4 = uVar4 + 1;
      plVar3 = plVar3 + 0x18;
    } while ((*ppUVar1)->v == pTVar5);
  }
  return (LClosure *)0x0;
}

Assistant:

static LClosure *getcached (Proto *p, UpVal **encup, StkId base) {
  LClosure *c = p->cache;
  if (c != NULL) {  /* is there a cached closure? */
    int nup = p->sizeupvalues;
    Upvaldesc *uv = p->upvalues;
    int i;
    for (i = 0; i < nup; i++) {  /* check whether it has right upvalues */
      TValue *v = uv[i].instack ? base + uv[i].idx : encup[uv[i].idx]->v;
      if (c->upvals[i]->v != v)
        return NULL;  /* wrong upvalue; cannot reuse closure */
    }
  }
  return c;  /* return cached closure (or NULL if no cached closure) */
}